

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketGroup<MediumAllocationBlockAttributes>::DisposeObjects
          (HeapBucketGroup<MediumAllocationBlockAttributes> *this)

{
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  ::DisposeObjects(&(this->finalizableHeapBucket).
                    super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                  );
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::DisposeObjects(&(this->smallFinalizableWithBarrierHeapBucket).
                    super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                  );
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::DisposeObjects()
{
    finalizableHeapBucket.DisposeObjects();
#ifdef RECYCLER_VISITED_HOST
    recyclerVisitedHostHeapBucket.DisposeObjects();
#endif
#ifdef RECYCLER_WRITE_BARRIER
    smallFinalizableWithBarrierHeapBucket.DisposeObjects();
#endif
}